

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O1

void project_object_handler_SOUND(project_object_handler_context_t *context)

{
  byte bVar1;
  char *pcVar2;
  
  bVar1 = context->obj->el_info[7].flags;
  if ((bVar1 & 1) != 0) {
    context->do_kill = true;
    pcVar2 = "shatter";
    if (context->obj->number == '\x01') {
      pcVar2 = "shatters";
    }
    context->note_kill = pcVar2;
    context->ignore = (_Bool)(bVar1 >> 1 & 1);
  }
  return;
}

Assistant:

static void project_object_elemental(project_object_handler_context_t *context,
									 int element, const char *singular_verb,
									 const char *plural_verb)
{
	if (context->obj->el_info[element].flags & EL_INFO_HATES) {
		context->do_kill = true;
		context->note_kill = VERB_AGREEMENT(context->obj->number,
											singular_verb, plural_verb);
		context->ignore = (context->obj->el_info[element].flags &
						   EL_INFO_IGNORE) ? true : false;
	}
}